

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_Locking::_Run(_Test_Locking *this)

{
  Tester *this_00;
  Status s;
  DB *db2;
  DB local_1c8;
  DB *local_1c0;
  Tester local_1b8;
  
  local_1c0 = (DB *)0x0;
  DBTest::CurrentOptions((Options *)&local_1b8,&this->super_DBTest);
  DB::Open(&local_1c8,(Options *)&local_1b8,(string *)this,&local_1c0);
  local_1b8.ok_ = true;
  local_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1b8.line_ = 0x6af;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8.ss_);
  this_00 = test::Tester::Is(&local_1b8,local_1c8._vptr_DB != (_func_int **)0x0,"!s.ok()");
  test::Tester::operator<<(this_00,(char (*) [38])"Locking did not prevent re-opening db");
  test::Tester::~Tester(&local_1b8);
  if (local_1c8._vptr_DB != (_func_int **)0x0) {
    operator_delete__(local_1c8._vptr_DB);
  }
  return;
}

Assistant:

TEST(DBTest, Locking) {
  DB* db2 = nullptr;
  Status s = DB::Open(CurrentOptions(), dbname_, &db2);
  ASSERT_TRUE(!s.ok()) << "Locking did not prevent re-opening db";
}